

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O3

int target_data_begin(DeviceTy *Device,int32_t arg_num,void **args_base,void **args,
                     int64_t *arg_sizes,int64_t *arg_types)

{
  ulong uVar1;
  undefined8 *HstPtrBegin;
  pthread_mutex_t *__mutex;
  void *pvVar2;
  int32_t iVar3;
  int iVar4;
  void *TgtPtrBegin;
  mapped_type *pmVar5;
  long lVar6;
  ulong uVar7;
  void *pvVar8;
  uint uVar9;
  long lVar10;
  undefined8 *HstPtrBase;
  ulong uVar11;
  bool UpdateRefCount;
  bool IsNew;
  bool Pointer_IsNew;
  void *TgtPtrBase;
  void *Pointer_HstPtrBegin;
  bool local_9a;
  bool local_99;
  DeviceTy *local_98;
  int64_t *local_90;
  void **local_88;
  void **local_80;
  void *local_78;
  ShadowPtrListTy *local_70;
  pthread_mutex_t *local_68;
  void *local_60;
  ulong local_58;
  int64_t *local_50;
  int64_t local_48;
  ulong local_40;
  undefined8 *local_38;
  
  if (arg_num < 1) {
    uVar9 = 0;
  }
  else {
    local_68 = (pthread_mutex_t *)&Device->ShadowMtx;
    local_70 = &Device->ShadowPtrMap;
    uVar7 = (ulong)(uint)arg_num;
    uVar9 = 1;
    uVar11 = 0;
    local_98 = Device;
    local_90 = arg_types;
    local_88 = args;
    local_80 = args_base;
    local_58 = uVar7;
    local_50 = arg_sizes;
    do {
      uVar1 = arg_types[uVar11];
      if ((uVar1 & 0x180) == 0) {
        pvVar8 = local_88[uVar11];
        lVar10 = local_50[uVar11];
        local_40 = uVar11 + 1;
        UpdateRefCount = uVar1 < 0x1000000000000;
        if ((((long)local_40 < (long)uVar7 && UpdateRefCount) &&
            (*(ushort *)((long)arg_types + uVar11 * 8 + 0xe) - 1 == uVar11)) &&
           (lVar6 = (long)pvVar8 % 8, lVar6 != 0)) {
          pvVar8 = (void *)((long)pvVar8 - lVar6);
          lVar10 = lVar10 + lVar6;
        }
        HstPtrBegin = (undefined8 *)local_80[uVar11];
        HstPtrBase = HstPtrBegin;
        if ((uVar1 & 0x10) != 0) {
          local_60 = DeviceTy::getOrAllocTgtPtr
                               (Device,HstPtrBegin,HstPtrBegin,8,&local_99,
                                (bool)((byte)(uVar1 >> 9) & 1),uVar1 < 0x1000000000000);
          if (local_60 == (void *)0x0) break;
          HstPtrBase = (undefined8 *)*HstPtrBegin;
          UpdateRefCount = true;
          Device = local_98;
          local_38 = HstPtrBegin;
        }
        local_48 = lVar10;
        TgtPtrBegin = DeviceTy::getOrAllocTgtPtr
                                (Device,pvVar8,HstPtrBase,lVar10,&local_9a,
                                 (bool)((byte)(uVar1 >> 9) & 1),UpdateRefCount);
        uVar7 = local_90[uVar11];
        if ((uVar7 & 0x40) != 0) {
          local_80[uVar11] = (void *)(((long)HstPtrBase - (long)pvVar8) + (long)TgtPtrBegin);
        }
        if (((uVar7 & 1) != 0) &&
           (((((uVar7 & 4) != 0 || (local_9a != false)) ||
             ((0xffffffffffff < uVar7 &&
              (lVar10 = DeviceTy::getMapEntryRefCnt(local_98,local_88[(ushort)(uVar7 >> 0x30) - 1]),
              lVar10 == 1)))) &&
            (iVar3 = DeviceTy::data_submit(local_98,TgtPtrBegin,pvVar8,local_48), iVar3 != 0))))
        break;
        pvVar2 = local_60;
        uVar7 = local_58;
        Device = local_98;
        arg_types = local_90;
        if ((*(byte *)(local_90 + uVar11) & 0x10) != 0) {
          local_78 = (void *)(((long)HstPtrBase - (long)pvVar8) + (long)TgtPtrBegin);
          iVar3 = DeviceTy::data_submit(local_98,local_60,&local_78,8);
          __mutex = local_68;
          if (iVar3 != 0) break;
          iVar4 = pthread_mutex_lock(local_68);
          pvVar8 = local_78;
          if (iVar4 != 0) {
            std::__throw_system_error(iVar4);
          }
          pmVar5 = std::
                   map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
                   ::operator[](local_70,&local_38);
          pmVar5->HstPtrVal = HstPtrBase;
          pmVar5->TgtPtrAddr = pvVar2;
          pmVar5->TgtPtrVal = pvVar8;
          pthread_mutex_unlock(__mutex);
          uVar7 = local_58;
          Device = local_98;
          arg_types = local_90;
        }
      }
      else {
        local_40 = uVar11 + 1;
      }
      uVar9 = (uint)((long)local_40 < (long)uVar7);
      uVar11 = local_40;
    } while (local_40 != uVar7);
  }
  return -uVar9;
}

Assistant:

int target_data_begin(DeviceTy &Device, int32_t arg_num,
    void **args_base, void **args, int64_t *arg_sizes, int64_t *arg_types) {
  // process each input.
  for (int32_t i = 0; i < arg_num; ++i) {
    // Ignore private variables and arrays - there is no mapping for them.
    if ((arg_types[i] & OMP_TGT_MAPTYPE_LITERAL) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PRIVATE))
      continue;

    void *HstPtrBegin = args[i];
    void *HstPtrBase = args_base[i];
    int64_t data_size = arg_sizes[i];

    // Adjust for proper alignment if this is a combined entry (for structs).
    // Look at the next argument - if that is MEMBER_OF this one, then this one
    // is a combined entry.
    int64_t padding = 0;
    const int next_i = i+1;
    if (member_of(arg_types[i]) < 0 && next_i < arg_num &&
        member_of(arg_types[next_i]) == i) {
      padding = (int64_t)HstPtrBegin % alignment;
      if (padding) {
        DP("Using a padding of %" PRId64 " bytes for begin address " DPxMOD
            "\n", padding, DPxPTR(HstPtrBegin));
        HstPtrBegin = (char *) HstPtrBegin - padding;
        data_size += padding;
      }
    }

    // Address of pointer on the host and device, respectively.
    void *Pointer_HstPtrBegin, *Pointer_TgtPtrBegin;
    bool IsNew, Pointer_IsNew;
    bool IsImplicit = arg_types[i] & OMP_TGT_MAPTYPE_IMPLICIT;
    // UpdateRef is based on MEMBER_OF instead of TARGET_PARAM because if we
    // have reached this point via __tgt_target_data_begin and not __tgt_target
    // then no argument is marked as TARGET_PARAM ("omp target data map" is not
    // associated with a target region, so there are no target parameters). This
    // may be considered a hack, we could revise the scheme in the future.
    bool UpdateRef = !(arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF);
    if (arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ) {
      DP("Has a pointer entry: \n");
      // base is address of pointer.
      Pointer_TgtPtrBegin = Device.getOrAllocTgtPtr(HstPtrBase, HstPtrBase,
          sizeof(void *), Pointer_IsNew, IsImplicit, UpdateRef);
      if (!Pointer_TgtPtrBegin) {
        DP("Call to getOrAllocTgtPtr returned null pointer (device failure or "
            "illegal mapping).\n");
        return OFFLOAD_FAIL;
      }
      DP("There are %zu bytes allocated at target address " DPxMOD " - is%s new"
          "\n", sizeof(void *), DPxPTR(Pointer_TgtPtrBegin),
          (Pointer_IsNew ? "" : " not"));
      Pointer_HstPtrBegin = HstPtrBase;
      // modify current entry.
      HstPtrBase = *(void **)HstPtrBase;
      UpdateRef = true; // subsequently update ref count of pointee
    }

    void *TgtPtrBegin = Device.getOrAllocTgtPtr(HstPtrBegin, HstPtrBase,
        data_size, IsNew, IsImplicit, UpdateRef);
    if (!TgtPtrBegin && data_size) {
      // If data_size==0, then the argument could be a zero-length pointer to
      // NULL, so getOrAlloc() returning NULL is not an error.
      DP("Call to getOrAllocTgtPtr returned null pointer (device failure or "
          "illegal mapping).\n");
    }
    DP("There are %" PRId64 " bytes allocated at target address " DPxMOD
        " - is%s new\n", data_size, DPxPTR(TgtPtrBegin),
        (IsNew ? "" : " not"));

    if (arg_types[i] & OMP_TGT_MAPTYPE_RETURN_PARAM) {
      uintptr_t Delta = (uintptr_t)HstPtrBegin - (uintptr_t)HstPtrBase;
      void *TgtPtrBase = (void *)((uintptr_t)TgtPtrBegin - Delta);
      DP("Returning device pointer " DPxMOD "\n", DPxPTR(TgtPtrBase));
      args_base[i] = TgtPtrBase;
    }

    if (arg_types[i] & OMP_TGT_MAPTYPE_TO) {
      bool copy = false;
      if (IsNew || (arg_types[i] & OMP_TGT_MAPTYPE_ALWAYS)) {
        copy = true;
      } else if (arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) {
        // Copy data only if the "parent" struct has RefCount==1.
        int32_t parent_idx = member_of(arg_types[i]);
        long parent_rc = Device.getMapEntryRefCnt(args[parent_idx]);
        assert(parent_rc > 0 && "parent struct not found");
        if (parent_rc == 1) {
          copy = true;
        }
      }

      if (copy) {
        DP("Moving %" PRId64 " bytes (hst:" DPxMOD ") -> (tgt:" DPxMOD ")\n",
            data_size, DPxPTR(HstPtrBegin), DPxPTR(TgtPtrBegin));
        int rt = Device.data_submit(TgtPtrBegin, HstPtrBegin, data_size);
        if (rt != OFFLOAD_SUCCESS) {
          DP("Copying data to device failed.\n");
          return OFFLOAD_FAIL;
        }
      }
    }

    if (arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ) {
      DP("Update pointer (" DPxMOD ") -> [" DPxMOD "]\n",
          DPxPTR(Pointer_TgtPtrBegin), DPxPTR(TgtPtrBegin));
      uint64_t Delta = (uint64_t)HstPtrBegin - (uint64_t)HstPtrBase;
      void *TgtPtrBase = (void *)((uint64_t)TgtPtrBegin - Delta);
      int rt = Device.data_submit(Pointer_TgtPtrBegin, &TgtPtrBase,
          sizeof(void *));
      if (rt != OFFLOAD_SUCCESS) {
        DP("Copying data to device failed.\n");
        return OFFLOAD_FAIL;
      }
      // create shadow pointers for this entry
      Device.ShadowMtx.lock();
      Device.ShadowPtrMap[Pointer_HstPtrBegin] = {HstPtrBase,
          Pointer_TgtPtrBegin, TgtPtrBase};
      Device.ShadowMtx.unlock();
    }
  }

  return OFFLOAD_SUCCESS;
}